

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_gui.cpp
# Opt level: O0

Uint32 getpixel(SDL_Surface *surface,int x,int y)

{
  uint uVar1;
  uint *puVar2;
  Uint8 *p;
  int bpp;
  int y_local;
  int x_local;
  SDL_Surface *surface_local;
  uint local_4;
  
  uVar1 = (uint)surface->format->BytesPerPixel;
  puVar2 = (uint *)((long)surface->pixels + (long)(int)(x * uVar1) + (long)(y * surface->pitch));
  switch(uVar1) {
  case 1:
    local_4 = (uint)(byte)*puVar2;
    break;
  case 2:
    local_4 = (uint)(ushort)*puVar2;
    break;
  case 3:
    local_4 = (uint)(uint3)*puVar2;
    break;
  case 4:
    local_4 = *puVar2;
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

Uint32 getpixel(SDL_Surface *surface, int x, int y) {
    int bpp = surface->format->BytesPerPixel;
    Uint8 *p = (Uint8 *) surface->pixels + y * surface->pitch + x * bpp;

    switch (bpp) {
        case 1:
            return *p;
        case 2:
            return *(Uint16 *) p;
        case 3:
            if (SDL_BYTEORDER == SDL_BIG_ENDIAN)
                return p[0] << 16 | p[1] << 8 | p[2];
            else
                return p[0] | p[1] << 8 | p[2] << 16;
        case 4:
            return *(Uint32 *) p;
            break;
        default:
            return 0;
    }
}